

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O3

void __thiscall capnp::compiler::NodeTranslator::StructLayout::Group::addMember(Group *this)

{
  Union *pUVar1;
  uint uVar2;
  uint uVar3;
  
  if (this->hasMembers == false) {
    this->hasMembers = true;
    pUVar1 = this->parent;
    uVar2 = pUVar1->groupCount + 1;
    pUVar1->groupCount = uVar2;
    if ((uVar2 == 2) && ((pUVar1->discriminantOffset).ptr.isSet == false)) {
      uVar3 = (*pUVar1->parent->_vptr_StructOrGroup[1])(pUVar1->parent,4);
      (pUVar1->discriminantOffset).ptr.field_1.value = uVar3;
      (pUVar1->discriminantOffset).ptr.isSet = true;
    }
  }
  return;
}

Assistant:

void addMember() {
      if (!hasMembers) {
        hasMembers = true;
        parent.newGroupAddingFirstMember();
      }
    }